

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

UtcTimeStamp *
FIX::UtcTimeStampConvertor::convert(UtcTimeStamp *__return_storage_ptr__,string *value)

{
  char cVar1;
  char cVar2;
  char cVar3;
  int year_00;
  int month;
  int date;
  int hour_00;
  int minute;
  int second;
  ulong uVar4;
  FieldConvertError *pFVar5;
  char *pcVar6;
  int local_58;
  char ch;
  int fraction;
  int sec;
  int min;
  int hour;
  int mday;
  int mon;
  int year;
  int c;
  size_t i;
  size_t len;
  string *value_local;
  
  uVar4 = std::__cxx11::string::size();
  if ((uVar4 < 0x11) || (0x1b < uVar4)) {
    pFVar5 = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(pFVar5,value);
    __cxa_throw(pFVar5,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  for (mon = 0; mon < 8; mon = mon + 1) {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
    if (9 < (int)*pcVar6 - 0x30U) {
      pFVar5 = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(pFVar5,value);
      __cxa_throw(pFVar5,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
    }
  }
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
  if (*pcVar6 != '-') {
    pFVar5 = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(pFVar5,value);
    __cxa_throw(pFVar5,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  for (mon = 0; mon < 2; mon = mon + 1) {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
    if (9 < (int)*pcVar6 - 0x30U) {
      pFVar5 = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(pFVar5,value);
      __cxa_throw(pFVar5,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
    }
  }
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
  if (*pcVar6 != ':') {
    pFVar5 = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(pFVar5,value);
    __cxa_throw(pFVar5,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  for (mon = 0; mon < 2; mon = mon + 1) {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
    if (9 < (int)*pcVar6 - 0x30U) {
      pFVar5 = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(pFVar5,value);
      __cxa_throw(pFVar5,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
    }
  }
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
  if (*pcVar6 != ':') {
    pFVar5 = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(pFVar5,value);
    __cxa_throw(pFVar5,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  for (mon = 0; mon < 2; mon = mon + 1) {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
    if (9 < (int)*pcVar6 - 0x30U) {
      pFVar5 = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(pFVar5,value);
      __cxa_throw(pFVar5,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
    }
  }
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
  cVar1 = *pcVar6;
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
  cVar2 = *pcVar6;
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
  cVar3 = *pcVar6;
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
  year_00 = (((cVar1 + -0x30) * 10 + (int)cVar2 + -0x30) * 10 + (int)cVar3 + -0x30) * 10 +
            (int)*pcVar6 + -0x30;
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
  cVar1 = *pcVar6;
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
  month = (cVar1 + -0x30) * 10 + (int)*pcVar6 + -0x30;
  if ((month < 1) || (0xc < month)) {
    pFVar5 = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(pFVar5,value);
    __cxa_throw(pFVar5,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
  cVar1 = *pcVar6;
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
  date = (cVar1 + -0x30) * 10 + (int)*pcVar6 + -0x30;
  if ((date < 1) || (0x1f < date)) {
    pFVar5 = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(pFVar5,value);
    __cxa_throw(pFVar5,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
  cVar1 = *pcVar6;
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
  hour_00 = (cVar1 + -0x30) * 10 + (int)*pcVar6 + -0x30;
  if (0x17 < hour_00) {
    pFVar5 = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(pFVar5,value);
    __cxa_throw(pFVar5,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
  cVar1 = *pcVar6;
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
  minute = (cVar1 + -0x30) * 10 + (int)*pcVar6 + -0x30;
  if (0x3b < minute) {
    pFVar5 = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(pFVar5,value);
    __cxa_throw(pFVar5,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
  cVar1 = *pcVar6;
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
  second = (cVar1 + -0x30) * 10 + (int)*pcVar6 + -0x30;
  if (0x3c < second) {
    pFVar5 = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(pFVar5,value);
    __cxa_throw(pFVar5,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  if (uVar4 == 0x11) {
    UtcTimeStamp::UtcTimeStamp(__return_storage_ptr__,hour_00,minute,second,0,date,month,year_00);
  }
  else {
    _year = 0x12;
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
    if (*pcVar6 != '.') {
      pFVar5 = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(pFVar5,value);
      __cxa_throw(pFVar5,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
    }
    local_58 = 0;
    for (; _year < uVar4; _year = _year + 1) {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)value);
      if (9 < (int)*pcVar6 - 0x30U) {
        pFVar5 = (FieldConvertError *)__cxa_allocate_exception(0x50);
        FieldConvertError::FieldConvertError(pFVar5,value);
        __cxa_throw(pFVar5,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
      }
      local_58 = local_58 * 10 + (int)*pcVar6 + -0x30;
    }
    UtcTimeStamp::UtcTimeStamp
              (__return_storage_ptr__,hour_00,minute,second,local_58,date,month,year_00,
               (int)uVar4 + -0x12);
  }
  return __return_storage_ptr__;
}

Assistant:

static UtcTimeStamp convert( const std::string& value )
  EXCEPT ( FieldConvertError )
  {
    size_t len = value.size();
    if (len < 17 || len > 27) throw FieldConvertError(value);

    size_t i = 0;
    int c = 0;
    for( c = 0; c < 8; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);
    if (value[i++] != '-') throw FieldConvertError(value);
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);
    if( value[i++] != ':' ) throw FieldConvertError(value);
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);
    if( value[i++] != ':' ) throw FieldConvertError(value);
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);

    int year, mon, mday, hour, min, sec;

    i = 0;

    year = value[i++] - '0';
    year = 10 * year + value[i++] - '0';
    year = 10 * year + value[i++] - '0';
    year = 10 * year + value[i++] - '0';

    mon = value[i++] - '0';
    mon = 10 * mon + value[i++] - '0';
    if( mon < 1 || 12 < mon ) throw FieldConvertError(value);

    mday = value[i++] - '0';
    mday = 10 * mday + value[i++] - '0';
    if( mday < 1 || 31 < mday ) throw FieldConvertError(value);

    ++i; // skip '-'

    hour = value[i++] - '0';
    hour = 10 * hour + value[i++] - '0';
    // No check for >= 0 as no '-' are converted here
    if( 23 < hour ) throw FieldConvertError(value);

    ++i; // skip ':'

    min = value[i++] - '0';
    min = 10 * min + value[i++] - '0';
    // No check for >= 0 as no '-' are converted here
    if( 59 < min ) throw FieldConvertError(value);

    ++i; // skip ':'

    sec = value[i++] - '0';
    sec = 10 * sec + value[i++] - '0';

    // No check for >= 0 as no '-' are converted here
    if( 60 < sec ) throw FieldConvertError(value);

    if (len == 17)
      return UtcTimeStamp (hour, min, sec, 0,
                           mday, mon, year);

    if( value[i++] != '.' ) throw FieldConvertError(value);

    int fraction = 0;
    for (; i < len; ++i)
    {
      char ch = value[i];
      if( !IS_DIGIT(ch)) throw FieldConvertError(value);
      fraction = (fraction * 10) + ch - '0';
    }

    return UtcTimeStamp (hour, min, sec, fraction,
                         mday, mon, year, len - 17 - 1);
  }